

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_slb_describe_zones.cc
# Opt level: O2

int __thiscall
aliyun::Slb::DescribeZones
          (Slb *this,SlbDescribeZonesRequestType *req,SlbDescribeZonesResponseType *response,
          SlbErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  Value *this_01;
  char *pcVar6;
  uint index;
  uint index_00;
  allocator<char> local_48c;
  allocator<char> local_48b;
  allocator<char> local_48a;
  allocator<char> local_489;
  Value val;
  undefined1 local_468 [24];
  string local_450 [8];
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  _Alloc_hider local_430;
  size_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  vector<aliyun::SlbDescribeZonesZoneType,_std::allocator<aliyun::SlbDescribeZonesZoneType>_>
  *local_410;
  Value *local_408;
  undefined1 local_400 [32];
  _Alloc_hider local_3e0;
  size_type local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  string str_response;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if (this->use_tls_ != false) {
    pcVar6 = "https";
  }
  local_410 = &response->zones;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar6,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)local_400);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&local_3a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar6,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"DescribeZones",(allocator<char> *)local_400);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OwnerId",(allocator<char> *)local_468);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"ResourceOwnerAccount",(allocator<char> *)local_468);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ResourceOwnerId",(allocator<char> *)local_468);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"OwnerAccount",(allocator<char> *)local_468);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"RegionId",(allocator<char> *)local_468);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,this->region_id_,(allocator<char> *)local_400);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (SlbErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_468,anon_var_dwarf_169eda + 9,&local_489);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_468);
        std::__cxx11::string::~string((string *)local_468);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_468,anon_var_dwarf_169eda + 9,&local_48a);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_468);
        std::__cxx11::string::~string((string *)local_468);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_468,anon_var_dwarf_169eda + 9,&local_48b);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_468);
        std::__cxx11::string::~string((string *)local_468);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_468,anon_var_dwarf_169eda + 9,&local_48c);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_468);
        std::__cxx11::string::~string((string *)local_468);
      }
      if (local_410 !=
          (vector<aliyun::SlbDescribeZonesZoneType,_std::allocator<aliyun::SlbDescribeZonesZoneType>_>
           *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Zones");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Zones");
          bVar1 = Json::Value::isMember(pVVar4,"Zone");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"Zones");
            pVVar4 = Json::Value::operator[](pVVar4,"Zone");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              local_408 = pVVar4;
              for (index_00 = 0; pVVar4 = local_408, AVar3 = Json::Value::size(local_408),
                  index_00 < AVar3; index_00 = index_00 + 1) {
                local_468._0_8_ = (pointer)0x0;
                local_468._8_8_ = (pointer)0x0;
                local_468._16_8_ = 0;
                local_450 = (string  [8])&local_440;
                local_448 = 0;
                local_440._M_local_buf[0] = '\0';
                local_430._M_p = (pointer)&local_420;
                local_428 = 0;
                local_420._M_local_buf[0] = '\0';
                pVVar4 = Json::Value::operator[](pVVar4,index_00);
                bVar1 = Json::Value::isMember(pVVar4,"ZoneId");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"ZoneId");
                  Json::Value::asString_abi_cxx11_((string *)local_400,pVVar5);
                  std::__cxx11::string::operator=(local_450,(string *)local_400);
                  std::__cxx11::string::~string((string *)local_400);
                }
                bVar1 = Json::Value::isMember(pVVar4,"LocalName");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"LocalName");
                  Json::Value::asString_abi_cxx11_((string *)local_400,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_430,(string *)local_400);
                  std::__cxx11::string::~string((string *)local_400);
                }
                bVar1 = Json::Value::isMember(pVVar4,"SlaveZones");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar4,"SlaveZones");
                  bVar1 = Json::Value::isMember(pVVar5,"SlaveZone");
                  if (bVar1) {
                    pVVar4 = Json::Value::operator[](pVVar4,"SlaveZones");
                    pVVar4 = Json::Value::operator[](pVVar4,"SlaveZone");
                    bVar1 = Json::Value::isArray(pVVar4);
                    if (bVar1) {
                      for (index = 0; AVar3 = Json::Value::size(pVVar4), index < AVar3;
                          index = index + 1) {
                        local_400._0_8_ = local_400 + 0x10;
                        local_400._8_8_ = 0;
                        local_400[0x10] = '\0';
                        local_3e0._M_p = (pointer)&local_3d0;
                        local_3d8 = 0;
                        local_3d0._M_local_buf[0] = '\0';
                        pVVar5 = Json::Value::operator[](pVVar4,index);
                        bVar1 = Json::Value::isMember(pVVar5,"ZoneId");
                        if (bVar1) {
                          this_01 = Json::Value::operator[](pVVar5,"ZoneId");
                          Json::Value::asString_abi_cxx11_(&local_3a0,this_01);
                          std::__cxx11::string::operator=((string *)local_400,(string *)&local_3a0);
                          std::__cxx11::string::~string((string *)&local_3a0);
                        }
                        bVar1 = Json::Value::isMember(pVVar5,"LocalName");
                        if (bVar1) {
                          pVVar5 = Json::Value::operator[](pVVar5,"LocalName");
                          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar5);
                          std::__cxx11::string::operator=((string *)&local_3e0,(string *)&local_3a0)
                          ;
                          std::__cxx11::string::~string((string *)&local_3a0);
                        }
                        std::
                        vector<aliyun::SlbDescribeZonesSlaveZoneType,_std::allocator<aliyun::SlbDescribeZonesSlaveZoneType>_>
                        ::push_back((vector<aliyun::SlbDescribeZonesSlaveZoneType,_std::allocator<aliyun::SlbDescribeZonesSlaveZoneType>_>
                                     *)local_468,(SlbDescribeZonesSlaveZoneType *)local_400);
                        SlbDescribeZonesSlaveZoneType::~SlbDescribeZonesSlaveZoneType
                                  ((SlbDescribeZonesSlaveZoneType *)local_400);
                      }
                    }
                  }
                }
                std::
                vector<aliyun::SlbDescribeZonesZoneType,_std::allocator<aliyun::SlbDescribeZonesZoneType>_>
                ::push_back(local_410,(SlbDescribeZonesZoneType *)local_468);
                SlbDescribeZonesZoneType::~SlbDescribeZonesZoneType
                          ((SlbDescribeZonesZoneType *)local_468);
              }
              iVar2 = 200;
            }
          }
        }
      }
      goto LAB_001455f0;
    }
  }
  iVar2 = -1;
  if (error_info != (SlbErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_001455f0:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Slb::DescribeZones(const SlbDescribeZonesRequestType& req,
                      SlbDescribeZonesResponseType* response,
                       SlbErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeZones");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}